

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O1

xmlChar * xmlTextReaderLookupNamespace(xmlTextReaderPtr reader,xmlChar *prefix)

{
  xmlNodePtr node;
  xmlNsPtr pxVar1;
  xmlChar *pxVar2;
  
  if ((reader != (xmlTextReaderPtr)0x0) && (node = reader->node, node != (xmlNodePtr)0x0)) {
    pxVar1 = xmlSearchNs(node->doc,node,prefix);
    if (pxVar1 != (xmlNsPtr)0x0) {
      pxVar2 = xmlStrdup(pxVar1->href);
      return pxVar2;
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlTextReaderLookupNamespace(xmlTextReaderPtr reader, const xmlChar *prefix) {
    xmlNsPtr ns;

    if (reader == NULL)
	return(NULL);
    if (reader->node == NULL)
	return(NULL);

    ns = xmlSearchNs(reader->node->doc, reader->node, prefix);
    if (ns == NULL)
	return(NULL);
    return(xmlStrdup(ns->href));
}